

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_erkstep.c
# Opt level: O2

int erkStep_Resize(ARKodeMem ark_mem,N_Vector y0,sunrealtype hscale,sunrealtype t0,
                  ARKVecResizeFn resize,void *resize_data)

{
  int iVar1;
  long lVar2;
  long lrw_diff;
  long liw_diff;
  long lVar3;
  sunindextype liw1;
  sunindextype lrw1;
  ARKodeERKStepMem step_mem;
  
  iVar1 = erkStep_AccessStepMem(ark_mem,"erkStep_Resize",&step_mem);
  if (iVar1 == 0) {
    liw1 = 0;
    lrw1 = 0;
    if (y0->ops->nvspace != (_func_void_N_Vector_sunindextype_ptr_sunindextype_ptr *)0x0) {
      N_VSpace(y0,&lrw1,&liw1);
    }
    lrw_diff = lrw1 - ark_mem->lrw1;
    liw_diff = liw1 - ark_mem->liw1;
    ark_mem->lrw1 = lrw1;
    ark_mem->liw1 = liw1;
    lVar3 = -1;
    lVar2 = 0;
    do {
      lVar3 = lVar3 + 1;
      if (step_mem->stages <= lVar3) {
        return 0;
      }
      iVar1 = arkResizeVec(ark_mem,resize,resize_data,lrw_diff,liw_diff,y0,
                           (N_Vector *)(lVar2 + (long)step_mem->F));
      lVar2 = lVar2 + 8;
    } while (iVar1 != 0);
    iVar1 = -0x14;
    arkProcessError(ark_mem,-0x14,0x100,"erkStep_Resize",
                    "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_erkstep.c"
                    ,"Unable to resize vector");
  }
  return iVar1;
}

Assistant:

int erkStep_Resize(ARKodeMem ark_mem, N_Vector y0,
                   SUNDIALS_MAYBE_UNUSED sunrealtype hscale,
                   SUNDIALS_MAYBE_UNUSED sunrealtype t0, ARKVecResizeFn resize,
                   void* resize_data)
{
  ARKodeERKStepMem step_mem;
  sunindextype lrw1, liw1, lrw_diff, liw_diff;
  int i, retval;

  /* access ARKodeERKStepMem structure */
  retval = erkStep_AccessStepMem(ark_mem, __func__, &step_mem);
  if (retval != ARK_SUCCESS) { return (retval); }

  /* Determine change in vector sizes */
  lrw1 = liw1 = 0;
  if (y0->ops->nvspace != NULL) { N_VSpace(y0, &lrw1, &liw1); }
  lrw_diff      = lrw1 - ark_mem->lrw1;
  liw_diff      = liw1 - ark_mem->liw1;
  ark_mem->lrw1 = lrw1;
  ark_mem->liw1 = liw1;

  /* Resize the RHS vectors */
  for (i = 0; i < step_mem->stages; i++)
  {
    if (!arkResizeVec(ark_mem, resize, resize_data, lrw_diff, liw_diff, y0,
                      &step_mem->F[i]))
    {
      arkProcessError(ark_mem, ARK_MEM_FAIL, __LINE__, __func__, __FILE__,
                      "Unable to resize vector");
      return (ARK_MEM_FAIL);
    }
  }

  return (ARK_SUCCESS);
}